

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O0

bool QBenchmarkValgrindUtils::haveValgrind(void)

{
  byte bVar1;
  long in_FS_OFFSET;
  QProcess process;
  OpenModeFlag in_stack_ffffffffffffff6c;
  QFlags<QIODeviceBase::OpenModeFlag> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  byte bVar2;
  undefined1 in_stack_ffffffffffffff7f;
  size_t in_stack_ffffffffffffff80;
  QList<QString> *this;
  char16_t *in_stack_ffffffffffffff88;
  QList<QString> local_60;
  undefined1 local_48 [24];
  undefined1 local_30 [24];
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  QProcess::QProcess((QProcess *)&local_18,(QObject *)0x0);
  Qt::Literals::StringLiterals::operator____s(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  this = &local_60;
  Qt::Literals::StringLiterals::operator____s(in_stack_ffffffffffffff88,(size_t)this);
  QList<QString>::QList<QString,void>
            (this,(QString *)
                  CONCAT17(in_stack_ffffffffffffff7f,
                           CONCAT16(in_stack_ffffffffffffff7e,
                                    CONCAT15(in_stack_ffffffffffffff7d,
                                             CONCAT14(in_stack_ffffffffffffff7c,
                                                      in_stack_ffffffffffffff78)))));
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  QProcess::start((QString *)&local_18,(QList_conflict *)local_30,(QFlags_conflict *)local_48);
  QList<QString>::~QList((QList<QString> *)0x1aceb4);
  QString::~QString((QString *)0x1acebe);
  QString::~QString((QString *)0x1acec8);
  bVar1 = QProcess::waitForStarted((int)&local_18);
  bVar2 = 0;
  if ((bVar1 & 1) != 0) {
    bVar2 = QProcess::waitForFinished((int)&local_18);
  }
  QProcess::~QProcess((QProcess *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool QBenchmarkValgrindUtils::haveValgrind()
{
#ifdef NVALGRIND
    return false;
#else
    QProcess process;
    process.start(u"valgrind"_s, QStringList(u"--version"_s));
    return process.waitForStarted() && process.waitForFinished(-1);
#endif
}